

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::Count(ON_wString *this,wchar_t ch)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  
  pwVar3 = this->m_s;
  iVar2 = 0;
  while( true ) {
    wVar1 = *pwVar3;
    if (wVar1 == L'\0') break;
    pwVar3 = pwVar3 + 1;
    iVar2 = iVar2 + (uint)(wVar1 == ch);
  }
  return iVar2;
}

Assistant:

int ON_wString::Count(wchar_t ch) const
{
  int count = 0;

  const wchar_t* p = m_s;
  while (*p != 0)
  {
    if (*p++ == ch)
      count++;
  }

  return count;
}